

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_gtar_large.c
# Opt level: O2

ssize_t myread(archive *a,void *client_data,void **buff)

{
  int iVar1;
  
  if (*client_data != (void *)0x0) {
    *buff = *client_data;
    *(undefined8 *)client_data = 0;
    return (long)*(int *)((long)client_data + 8);
  }
  iVar1 = *(int *)((long)client_data + 0xc);
  if (0 < iVar1) {
    *buff = *(void **)((long)client_data + 0x10);
    *(int *)((long)client_data + 0xc) = iVar1 + -1;
    return 0x200;
  }
  return 0;
}

Assistant:

static ssize_t
myread(struct archive *a, void *client_data, const void **buff)
{
  struct my_reader *reader = client_data;
  (void)a; /* UNUSED */

  if (reader->prefix != NULL) {
	  *buff = reader->prefix;
	  reader->prefix = NULL;
	  return reader->prefix_length;
  } else if (reader->zero_blocks_remaining > 0) {
	  *buff = reader->zero_block;
	  reader->zero_blocks_remaining -= 1;
	  return 512;
  } else {
	  return 0;
  }
}